

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O2

ssize_t __thiscall
libchars::terminal_driver::write(terminal_driver *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  int *piVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  void *pvVar4;
  void *__buf_00;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  pvVar4 = (void *)((long)__buf + (long)__buf_00);
  uVar3 = 0xffffffffffffffff;
  do {
    while( true ) {
      if (pvVar4 <= __buf_00) {
        uVar3 = 0;
        goto LAB_001168db;
      }
      sVar1 = ::write(this->fd_w,__buf_00,(long)pvVar4 - (long)__buf_00);
      if (0 < sVar1) break;
      if (sVar1 == 0) goto LAB_001168db;
      piVar2 = __errno_location();
      if ((*piVar2 != 4) && (*piVar2 != 0xb)) {
LAB_001168db:
        return uVar3 & 0xffffffff;
      }
    }
    __buf_00 = (void *)((long)__buf_00 + sVar1);
  } while( true );
}

Assistant:

int terminal_driver::write(const char *sequence, size_t seqlen)
    {
        const char *const seqend = sequence + seqlen;

        while (sequence < seqend) {
            ssize_t n = ::write(fd_w, sequence, (size_t)(seqend - sequence));
            if (n > 0) {
                sequence += n;
            }
            else {
                if (n == 0)
                    return -1;
                if (errno != EINTR && errno != EWOULDBLOCK)
                    return -1;
            }
        }
        return 0;
    }